

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitTableSet(FunctionValidator *this,TableSet *curr)

{
  bool bVar1;
  Table *pTVar2;
  
  shouldBeTrue<wasm::TableSet*>
            (this,(bool)((byte)((((this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .currModule)->features).features >> 8) & 1),curr,
             "table.set requires reference types [--enable-reference-types]");
  pTVar2 = Module::getTableOrNull
                     ((this->
                      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                      ).
                      super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .
                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .currModule,(Name)(curr->table).super_IString.str);
  bVar1 = shouldBeTrue<wasm::TableSet*>
                    (this,pTVar2 != (Table *)0x0,curr,"table.set table must exist");
  if (bVar1) {
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)46>).super_Expression.type.id != 1) {
      shouldBeSubType(this,(Type)(curr->value->type).id,(Type)(pTVar2->type).id,(Expression *)curr,
                      "table.set value must have right type");
    }
    shouldBeEqualOrFirstIsUnreachable<wasm::TableSet*,wasm::Type>
              (this,(Type)(curr->index->type).id,(Type)(pTVar2->addressType).id,curr,
               "table.set index must match the table index type.");
    return;
  }
  return;
}

Assistant:

void FunctionValidator::visitTableSet(TableSet* curr) {
  shouldBeTrue(getModule()->features.hasReferenceTypes(),
               curr,
               "table.set requires reference types [--enable-reference-types]");
  auto* table = getModule()->getTableOrNull(curr->table);
  if (shouldBeTrue(!!table, curr, "table.set table must exist")) {
    if (curr->type != Type::unreachable) {
      shouldBeSubType(curr->value->type,
                      table->type,
                      curr,
                      "table.set value must have right type");
    }
    shouldBeEqualOrFirstIsUnreachable(
      curr->index->type,
      table->addressType,
      curr,
      "table.set index must match the table index type.");
  }
}